

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  bool local_81d;
  REF_STATUS ref_private_macro_code_rss_98;
  REF_STATUS ref_private_macro_code_rss_97;
  REF_STATUS ref_private_macro_code_rss_96;
  REF_LONG ref_private_status_reis_bi_48;
  REF_LONG ref_private_status_reis_ai_48;
  REF_LONG ref_private_status_reis_bi_47;
  REF_LONG ref_private_status_reis_ai_47;
  REF_LONG ref_private_status_reis_bi_46;
  REF_LONG ref_private_status_reis_ai_46;
  REF_STATUS ref_private_macro_code_rss_95;
  REF_STATUS ref_private_macro_code_rss_94;
  REF_STATUS ref_private_macro_code_rss_93;
  REF_GRID_conflict ref_grid_18;
  long lStack_7c0;
  REF_STATUS ref_private_macro_code_rss_92;
  REF_LONG ref_private_status_reis_bi_45;
  REF_LONG ref_private_status_reis_ai_45;
  REF_LONG ref_private_status_reis_bi_44;
  REF_LONG ref_private_status_reis_ai_44;
  REF_STATUS ref_private_macro_code_rss_91;
  REF_STATUS ref_private_macro_code_rss_90;
  REF_GRID_conflict ref_grid_17;
  long lStack_788;
  REF_STATUS ref_private_macro_code_rss_89;
  REF_LONG ref_private_status_reis_bi_43;
  REF_LONG ref_private_status_reis_ai_43;
  long lStack_770;
  REF_STATUS ref_private_macro_code_rss_88;
  REF_LONG ref_private_status_reis_bi_42;
  REF_LONG ref_private_status_reis_ai_42;
  uint local_758;
  REF_STATUS ref_private_macro_code_rss_87;
  REF_STATUS ref_private_macro_code_rss_86;
  REF_BOOL allowed_8;
  REF_INT remove;
  REF_INT keep;
  REF_GRID_conflict ref_grid_16;
  long lStack_738;
  REF_STATUS ref_private_macro_code_rss_85;
  REF_LONG ref_private_status_reis_bi_41;
  REF_LONG ref_private_status_reis_ai_41;
  REF_LONG ref_private_status_reis_bi_40;
  REF_LONG ref_private_status_reis_ai_40;
  uint local_710;
  REF_STATUS ref_private_macro_code_rss_84;
  REF_STATUS ref_private_macro_code_rss_83;
  REF_STATUS ref_private_macro_code_rss_82;
  REF_GRID_conflict ref_grid_15;
  long lStack_6f8;
  REF_STATUS ref_private_macro_code_rss_81;
  REF_LONG ref_private_status_reis_bi_39;
  REF_LONG ref_private_status_reis_ai_39;
  REF_LONG ref_private_status_reis_bi_38;
  REF_LONG ref_private_status_reis_ai_38;
  REF_STATUS ref_private_macro_code_rss_80;
  REF_STATUS ref_private_macro_code_rss_79;
  REF_GRID_conflict ref_grid_14;
  long lStack_6c0;
  REF_STATUS ref_private_macro_code_rss_78;
  REF_LONG ref_private_status_reis_bi_37;
  REF_LONG ref_private_status_reis_ai_37;
  long lStack_6a8;
  REF_STATUS ref_private_macro_code_rss_77;
  REF_LONG ref_private_status_reis_bi_36;
  REF_LONG ref_private_status_reis_ai_36;
  uint local_690;
  REF_STATUS ref_private_macro_code_rss_76;
  REF_STATUS ref_private_macro_code_rss_75;
  REF_BOOL allowed_7;
  REF_INT node1_12;
  REF_INT node0_12;
  REF_GRID_conflict ref_grid_13;
  long lStack_670;
  REF_STATUS ref_private_macro_code_rss_74;
  REF_LONG ref_private_status_reis_bi_35;
  REF_LONG ref_private_status_reis_ai_35;
  long lStack_658;
  REF_STATUS ref_private_macro_code_rss_73;
  REF_LONG ref_private_status_reis_bi_34;
  REF_LONG ref_private_status_reis_ai_34;
  long lStack_640;
  REF_STATUS ref_private_macro_code_rss_72;
  REF_LONG ref_private_status_reis_bi_33;
  REF_LONG ref_private_status_reis_ai_33;
  uint local_628;
  REF_STATUS ref_private_macro_code_rss_71;
  REF_STATUS ref_private_macro_code_rss_70;
  REF_BOOL allowed_6;
  REF_INT node1_11;
  REF_INT node0_11;
  REF_GRID_conflict ref_grid_12;
  long lStack_608;
  REF_STATUS ref_private_macro_code_rss_69;
  REF_LONG ref_private_status_reis_bi_32;
  REF_LONG ref_private_status_reis_ai_32;
  uint local_5f0;
  REF_STATUS ref_private_macro_code_rss_68;
  REF_STATUS ref_private_macro_code_rss_67;
  REF_BOOL allowed_5;
  REF_INT node1_10;
  REF_INT node0_10;
  REF_GRID_conflict ref_grid_11;
  long lStack_5d0;
  REF_STATUS ref_private_macro_code_rss_66;
  REF_LONG ref_private_status_reis_bi_31;
  REF_LONG ref_private_status_reis_ai_31;
  long lStack_5b8;
  REF_STATUS ref_private_macro_code_rss_65;
  REF_LONG ref_private_status_reis_bi_30;
  REF_LONG ref_private_status_reis_ai_30;
  long lStack_5a0;
  REF_STATUS ref_private_macro_code_rss_64;
  REF_LONG ref_private_status_reis_bi_29;
  REF_LONG ref_private_status_reis_ai_29;
  uint local_588;
  REF_STATUS ref_private_macro_code_rss_63;
  REF_STATUS ref_private_macro_code_rss_62;
  REF_STATUS ref_private_macro_code_rss_61;
  REF_STATUS ref_private_macro_code_rss_60;
  REF_STATUS ref_private_macro_code_rss_59;
  REF_STATUS ref_private_macro_code_rss_58;
  REF_BOOL allowed_4;
  REF_INT tri2_2;
  REF_INT tri1_2;
  REF_INT nodes_4 [4];
  REF_INT node1_9;
  REF_INT node0_9;
  REF_INT node_2;
  REF_GRID_conflict ref_grid_10;
  long lStack_530;
  REF_STATUS ref_private_macro_code_rss_57;
  REF_LONG ref_private_status_reis_bi_28;
  REF_LONG ref_private_status_reis_ai_28;
  long lStack_518;
  REF_STATUS ref_private_macro_code_rss_56;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  long lStack_500;
  REF_STATUS ref_private_macro_code_rss_55;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_DBL params_1 [2];
  REF_INT id_1;
  REF_INT type_1;
  REF_INT node_1;
  REF_BOOL allowed_3;
  REF_INT tri2_1;
  REF_INT tri1_1;
  REF_INT nodes_3 [4];
  REF_INT node1_8;
  REF_INT node0_8;
  REF_GRID_conflict ref_grid_9;
  long lStack_478;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_DBL params [2];
  REF_INT id;
  REF_INT type;
  REF_INT node;
  REF_BOOL allowed_2;
  REF_INT node1_7;
  REF_INT node0_7;
  REF_GRID_conflict ref_grid_8;
  long lStack_418;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  long lStack_400;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  long lStack_3e8;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  uint local_3d0;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_BOOL allowed_1;
  REF_INT tri2;
  REF_INT tri1;
  REF_INT nodes_2 [4];
  REF_INT node1_6;
  REF_INT node0_6;
  REF_GRID_conflict ref_grid_7;
  long lStack_388;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_BOOL allowed;
  REF_INT node1_5;
  REF_INT node0_5;
  REF_GRID_conflict ref_grid_6;
  long lStack_350;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  long lStack_328;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  long lStack_2f0;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_INT nodes_1 [27];
  REF_INT node1_4;
  REF_INT node0_4;
  REF_GRID_conflict ref_grid_5;
  long lStack_228;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_INT node1_3;
  REF_INT node0_3;
  REF_GRID_conflict ref_grid_4;
  long lStack_1e8;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_INT node1_2;
  REF_INT node0_2;
  REF_GRID_conflict ref_grid_3;
  long lStack_198;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  long lStack_170;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_INT nodes [27];
  REF_INT node1_1;
  REF_INT node0_1;
  REF_GRID_conflict ref_grid_2;
  long lStack_b0;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_INT node1;
  REF_INT node0;
  REF_GRID_conflict ref_grid_1;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT pass;
  REF_GRID_conflict ref_grid;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_MPI ref_mpi;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ref_mpi = (REF_MPI)argv;
  argv_local._0_4_ = argc;
  ref_grid._4_4_ = ref_mpi_start(argc,argv);
  if (ref_grid._4_4_ == 0) {
    ref_grid._0_4_ = ref_mpi_create((REF_MPI *)&ref_private_macro_code_rss_1);
    if ((uint)ref_grid == 0) {
      if ((int)argv_local < 3) {
        ref_private_status_reis_ai._4_4_ =
             ref_fixture_tet_grid((REF_GRID *)&node1,_ref_private_macro_code_rss_1);
        if (ref_private_status_reis_ai._4_4_ == 0) {
          ref_private_macro_code_rss_15 = 0;
          ref_private_macro_code_rss_16 = 3;
          ref_private_status_reis_ai._0_4_ = ref_collapse_edge(_node1,0,3);
          if ((uint)ref_private_status_reis_ai == 0) {
            ref_private_status_reis_bi = 0;
            ref_private_status_reis_ai_1 = (REF_LONG)_node1->cell[8]->n;
            if (ref_private_status_reis_ai_1 == 0) {
              ref_private_status_reis_bi_1 = 1;
              ref_private_status_reis_ai_2 = (REF_LONG)_node1->cell[3]->n;
              if (ref_private_status_reis_ai_2 == 1) {
                ref_private_status_reis_bi_2 = 1;
                lStack_b0 = (long)_node1->cell[0]->n;
                if (lStack_b0 == 1) {
                  ref_grid_2._4_4_ = ref_grid_free(_node1);
                  if (ref_grid_2._4_4_ == 0) {
                    ref_private_status_reis_ai_3._4_4_ =
                         ref_fixture_tet_grid((REF_GRID *)&node1_1,_ref_private_macro_code_rss_1);
                    if (ref_private_status_reis_ai_3._4_4_ == 0) {
                      nodes[0x1a] = 1;
                      ref_private_status_reis_ai_3._0_4_ = ref_collapse_edge(_node1_1,0,1);
                      if ((uint)ref_private_status_reis_ai_3 == 0) {
                        ref_private_status_reis_bi_3 = 0;
                        ref_private_status_reis_ai_4 = (REF_LONG)_node1_1->cell[8]->n;
                        if (ref_private_status_reis_ai_4 == 0) {
                          ref_private_status_reis_bi_4 = 0;
                          ref_private_status_reis_ai_5 = (REF_LONG)_node1_1->cell[3]->n;
                          if (ref_private_status_reis_ai_5 == 0) {
                            ref_private_status_reis_bi_5 = 1;
                            lStack_170 = (long)_node1_1->cell[0]->n;
                            if (lStack_170 == 1) {
                              ref_private_status_reis_ai_6._4_4_ =
                                   ref_cell_nodes(_node1_1->cell[0],0,&ref_private_macro_code_rss_19
                                                 );
                              if (ref_private_status_reis_ai_6._4_4_ == 0) {
                                ref_private_status_reis_bi_6 = 0;
                                ref_private_status_reis_ai_7 =
                                     (REF_LONG)ref_private_macro_code_rss_19;
                                if (ref_private_status_reis_ai_7 == 0) {
                                  ref_private_status_reis_bi_7 = 2;
                                  lStack_198 = (long)ref_private_macro_code_rss_18;
                                  if (lStack_198 == 2) {
                                    ref_grid_3._4_4_ = ref_grid_free(_node1_1);
                                    if (ref_grid_3._4_4_ == 0) {
                                      ref_private_status_reis_ai_8._4_4_ =
                                           ref_fixture_tet_grid
                                                     ((REF_GRID *)&node1_2,
                                                      _ref_private_macro_code_rss_1);
                                      if (ref_private_status_reis_ai_8._4_4_ == 0) {
                                        ref_private_macro_code_rss_22 = 1;
                                        ref_private_macro_code_rss_23 = 2;
                                        ref_private_status_reis_ai_8._0_4_ =
                                             ref_collapse_edge(_node1_2,1,2);
                                        if ((uint)ref_private_status_reis_ai_8 == 0) {
                                          ref_private_status_reis_bi_8 = 0;
                                          ref_private_status_reis_ai_9 =
                                               (REF_LONG)_node1_2->cell[8]->n;
                                          if (ref_private_status_reis_ai_9 == 0) {
                                            ref_private_status_reis_bi_9 = 0;
                                            ref_private_status_reis_ai_10 =
                                                 (REF_LONG)_node1_2->cell[3]->n;
                                            if (ref_private_status_reis_ai_10 == 0) {
                                              ref_private_status_reis_bi_10 = 0;
                                              lStack_1e8 = (long)_node1_2->cell[0]->n;
                                              if (lStack_1e8 == 0) {
                                                ref_grid_4._4_4_ = ref_grid_free(_node1_2);
                                                if (ref_grid_4._4_4_ == 0) {
                                                  ref_private_status_reis_ai_11._4_4_ =
                                                       ref_fixture_tet_grid
                                                                 ((REF_GRID *)&node1_3,
                                                                  _ref_private_macro_code_rss_1);
                                                  if (ref_private_status_reis_ai_11._4_4_ == 0) {
                                                    ref_private_macro_code_rss_25 = 0;
                                                    ref_private_macro_code_rss_26 = 3;
                                                    ref_private_status_reis_ai_11._0_4_ =
                                                         ref_collapse_edge(_node1_3,0,3);
                                                    if ((uint)ref_private_status_reis_ai_11 == 0) {
                                                      ref_private_status_reis_bi_11 = 3;
                                                      ref_private_status_reis_ai_12 =
                                                           (REF_LONG)_node1_3->node->n;
                                                      if (ref_private_status_reis_ai_12 == 3) {
                                                        ref_private_status_reis_bi_12 = 0;
                                                        local_81d = false;
                                                        if (3 < _node1_3->node->max) {
                                                          local_81d = -1 < _node1_3->node->global[3]
                                                          ;
                                                        }
                                                        lStack_228 = (long)(int)(uint)local_81d;
                                                        if (lStack_228 == 0) {
                                                          ref_grid_5._4_4_ = ref_grid_free(_node1_3)
                                                          ;
                                                          if (ref_grid_5._4_4_ == 0) {
                                                            ref_private_status_reis_ai_13._4_4_ =
                                                                 ref_fixture_tet_grid
                                                                           ((REF_GRID *)&node1_4,
                                                                                                                                                        
                                                  _ref_private_macro_code_rss_1);
                                                  if (ref_private_status_reis_ai_13._4_4_ == 0) {
                                                    ref_private_status_reis_ai_13._0_4_ =
                                                         ref_collapse_edge(_node1_4,3,1);
                                                    if ((uint)ref_private_status_reis_ai_13 == 0) {
                                                      ref_private_status_reis_bi_13 = 0;
                                                      ref_private_status_reis_ai_14 =
                                                           (REF_LONG)_node1_4->cell[8]->n;
                                                      if (ref_private_status_reis_ai_14 == 0) {
                                                        ref_private_status_reis_bi_14 = 1;
                                                        ref_private_status_reis_ai_15 =
                                                             (REF_LONG)_node1_4->cell[3]->n;
                                                        if (ref_private_status_reis_ai_15 == 1) {
                                                          ref_private_status_reis_bi_15 = 1;
                                                          lStack_2f0 = (long)_node1_4->cell[0]->n;
                                                          if (lStack_2f0 == 1) {
                                                            ref_private_status_reis_ai_16._4_4_ =
                                                                 ref_cell_nodes(_node1_4->cell[3],0,
                                                                                &
                                                  ref_private_macro_code_rss_29);
                                                  if (ref_private_status_reis_ai_16._4_4_ == 0) {
                                                    ref_private_status_reis_bi_16 = 0;
                                                    ref_private_status_reis_ai_17 =
                                                         (REF_LONG)ref_private_macro_code_rss_29;
                                                    if (ref_private_status_reis_ai_17 == 0) {
                                                      ref_private_status_reis_bi_17 = 3;
                                                      ref_private_status_reis_ai_18 =
                                                           (REF_LONG)ref_private_macro_code_rss_28;
                                                      if (ref_private_status_reis_ai_18 == 3) {
                                                        ref_private_status_reis_bi_18 = 2;
                                                        lStack_328 = (long)nodes_1[0];
                                                        if (lStack_328 == 2) {
                                                          ref_private_status_reis_ai_19._4_4_ =
                                                               ref_cell_nodes(_node1_4->cell[0],0,
                                                                              &
                                                  ref_private_macro_code_rss_29);
                                                  if (ref_private_status_reis_ai_19._4_4_ == 0) {
                                                    ref_private_status_reis_bi_19 = 3;
                                                    ref_private_status_reis_ai_20 =
                                                         (REF_LONG)ref_private_macro_code_rss_29;
                                                    if (ref_private_status_reis_ai_20 == 3) {
                                                      ref_private_status_reis_bi_20 = 2;
                                                      lStack_350 = (long)
                                                  ref_private_macro_code_rss_28;
                                                  if (lStack_350 == 2) {
                                                    ref_grid_6._4_4_ = ref_grid_free(_node1_4);
                                                    if (ref_grid_6._4_4_ == 0) {
                                                      ref_private_macro_code_rss_35 =
                                                           ref_fixture_tet_grid
                                                                     ((REF_GRID *)&node1_5,
                                                                      _ref_private_macro_code_rss_1)
                                                      ;
                                                      if (ref_private_macro_code_rss_35 == 0) {
                                                        ref_private_status_reis_ai_21._4_4_ =
                                                             ref_cell_remove(_node1_5->cell[3],0);
                                                        if (ref_private_status_reis_ai_21._4_4_ == 0
                                                           ) {
                                                          allowed = 0;
                                                          ref_private_macro_code_rss_33 = 1;
                                                          ref_private_status_reis_ai_21._0_4_ =
                                                               ref_collapse_edge_geometry
                                                                         (_node1_5,0,1,
                                                                          &
                                                  ref_private_macro_code_rss_34);
                                                  if ((uint)ref_private_status_reis_ai_21 == 0) {
                                                    ref_private_status_reis_bi_21 = 1;
                                                    lStack_388 = (long)ref_private_macro_code_rss_34
                                                    ;
                                                    if (lStack_388 == 1) {
                                                      ref_grid_7._4_4_ = ref_grid_free(_node1_5);
                                                      if (ref_grid_7._4_4_ == 0) {
                                                        ref_private_macro_code_rss_39 =
                                                             ref_fixture_tet_grid
                                                                       ((REF_GRID *)&node1_6,
                                                                                                                                                
                                                  _ref_private_macro_code_rss_1);
                                                  if (ref_private_macro_code_rss_39 == 0) {
                                                    tri2 = 1;
                                                    tri1 = 4;
                                                    nodes_2[0] = 2;
                                                    nodes_2[1] = 10;
                                                    ref_private_macro_code_rss_40 =
                                                         ref_cell_add(_node1_6->cell[3],&tri2,
                                                                      &allowed_1);
                                                    if (ref_private_macro_code_rss_40 == 0) {
                                                      tri2 = 1;
                                                      tri1 = 5;
                                                      nodes_2[0] = 4;
                                                      nodes_2[1] = 10;
                                                      local_3d0 = ref_cell_add(_node1_6->cell[3],
                                                                               &tri2,&
                                                  ref_private_macro_code_rss_37);
                                                  if (local_3d0 == 0) {
                                                    ref_private_status_reis_ai_22._4_4_ =
                                                         ref_collapse_edge_geometry
                                                                   (_node1_6,0,3,
                                                                    &ref_private_macro_code_rss_38);
                                                    if (ref_private_status_reis_ai_22._4_4_ == 0) {
                                                      ref_private_status_reis_bi_22 = 1;
                                                      lStack_3e8 = (long)
                                                  ref_private_macro_code_rss_38;
                                                  if (lStack_3e8 == 1) {
                                                    ref_private_status_reis_ai_23._4_4_ =
                                                         ref_collapse_edge_geometry
                                                                   (_node1_6,0,1,
                                                                    &ref_private_macro_code_rss_38);
                                                    if (ref_private_status_reis_ai_23._4_4_ == 0) {
                                                      ref_private_status_reis_bi_23 = 1;
                                                      lStack_400 = (long)
                                                  ref_private_macro_code_rss_38;
                                                  if (lStack_400 == 1) {
                                                    _node1_6->cell[3]->c2n
                                                    [_node1_6->cell[3]->size_per *
                                                     ref_private_macro_code_rss_37 + 3] = 0x14;
                                                    ref_private_status_reis_ai_24._4_4_ =
                                                         ref_collapse_edge_geometry
                                                                   (_node1_6,4,1,
                                                                    &ref_private_macro_code_rss_38);
                                                    if (ref_private_status_reis_ai_24._4_4_ == 0) {
                                                      ref_private_status_reis_bi_24 = 1;
                                                      lStack_418 = (long)
                                                  ref_private_macro_code_rss_38;
                                                  if (lStack_418 == 1) {
                                                    ref_grid_8._4_4_ = ref_grid_free(_node1_6);
                                                    if (ref_grid_8._4_4_ == 0) {
                                                      ref_private_macro_code_rss_46 =
                                                           ref_fixture_tet_grid
                                                                     ((REF_GRID *)&node1_7,
                                                                      _ref_private_macro_code_rss_1)
                                                      ;
                                                      if (ref_private_macro_code_rss_46 == 0) {
                                                        ref_private_macro_code_rss_47 =
                                                             ref_cell_remove(_node1_7->cell[3],0);
                                                        if (ref_private_macro_code_rss_47 == 0) {
                                                          ref_private_status_reis_ai_25._4_4_ =
                                                               ref_geom_add(_node1_7->geom,1,0,0x19,
                                                                            (REF_DBL *)
                                                                            &
                                                  ref_private_macro_code_rss_45);
                                                  if (ref_private_status_reis_ai_25._4_4_ == 0) {
                                                    allowed_2 = 0;
                                                    node = 1;
                                                    ref_private_status_reis_ai_25._0_4_ =
                                                         ref_collapse_edge_geometry
                                                                   (_node1_7,0,1,&type);
                                                    if ((uint)ref_private_status_reis_ai_25 == 0) {
                                                      ref_private_status_reis_bi_25 = 0;
                                                      lStack_478 = (long)type;
                                                      if (lStack_478 == 0) {
                                                        ref_grid_9._4_4_ = ref_grid_free(_node1_7);
                                                        if (ref_grid_9._4_4_ == 0) {
                                                          ref_private_macro_code_rss_51 =
                                                               ref_fixture_tet_grid
                                                                         ((REF_GRID *)&node1_8,
                                                                                                                                                    
                                                  _ref_private_macro_code_rss_1);
                                                  if (ref_private_macro_code_rss_51 == 0) {
                                                    tri2_1 = 1;
                                                    tri1_1 = 4;
                                                    nodes_3[0] = 2;
                                                    nodes_3[1] = 10;
                                                    ref_private_macro_code_rss_52 =
                                                         ref_cell_add(_node1_8->cell[3],&tri2_1,
                                                                      &allowed_3);
                                                    if (ref_private_macro_code_rss_52 == 0) {
                                                      tri2_1 = 1;
                                                      tri1_1 = 5;
                                                      nodes_3[0] = 4;
                                                      nodes_3[1] = 10;
                                                      ref_private_macro_code_rss_53 =
                                                           ref_cell_add(_node1_8->cell[3],&tri2_1,
                                                                        &node_1);
                                                      if (ref_private_macro_code_rss_53 == 0) {
                                                        _ref_private_macro_code_rss_50 = 1.0;
                                                        ref_private_macro_code_rss_54 =
                                                             ref_geom_add(_node1_8->geom,1,1,0x14,
                                                                          (REF_DBL *)
                                                                          &
                                                  ref_private_macro_code_rss_50);
                                                  if (ref_private_macro_code_rss_54 == 0) {
                                                    _ref_private_macro_code_rss_50 = 2.0;
                                                    ref_private_status_reis_ai_26._4_4_ =
                                                         ref_geom_add(_node1_8->geom,2,1,0x14,
                                                                      (REF_DBL *)
                                                                      &ref_private_macro_code_rss_50
                                                                     );
                                                    if (ref_private_status_reis_ai_26._4_4_ == 0) {
                                                      ref_private_status_reis_ai_26._0_4_ =
                                                           ref_collapse_edge_geometry
                                                                     (_node1_8,1,4,&type_1);
                                                      if ((uint)ref_private_status_reis_ai_26 == 0)
                                                      {
                                                        ref_private_status_reis_bi_26 = 1;
                                                        lStack_500 = (long)type_1;
                                                        if (lStack_500 == 1) {
                                                          ref_private_status_reis_ai_27._4_4_ =
                                                               ref_collapse_edge_geometry
                                                                         (_node1_8,4,1,&type_1);
                                                          if (ref_private_status_reis_ai_27._4_4_ ==
                                                              0) {
                                                            ref_private_status_reis_bi_27 = 0;
                                                            lStack_518 = (long)type_1;
                                                            if (lStack_518 == 0) {
                                                              ref_private_status_reis_ai_28._4_4_ =
                                                                   ref_collapse_edge_geometry
                                                                             (_node1_8,1,2,&type_1);
                                                              if (ref_private_status_reis_ai_28.
                                                                  _4_4_ == 0) {
                                                                ref_private_status_reis_bi_28 = 1;
                                                                lStack_530 = (long)type_1;
                                                                if (lStack_530 == 1) {
                                                                  ref_grid_10._4_4_ =
                                                                       ref_grid_free(_node1_8);
                                                                  if (ref_grid_10._4_4_ == 0) {
                                                                    ref_private_macro_code_rss_60 =
                                                                         ref_fixture_tet_grid
                                                                                   ((REF_GRID *)
                                                                                    &node0_9,
                                                  _ref_private_macro_code_rss_1);
                                                  if (ref_private_macro_code_rss_60 == 0) {
                                                    ref_private_macro_code_rss_61 =
                                                         ref_node_add(_node0_9->node,4,&node1_9);
                                                    if (ref_private_macro_code_rss_61 == 0) {
                                                      _node0_9->node->real[node1_9 * 0xf] = 1.0;
                                                      _node0_9->node->real[node1_9 * 0xf + 1] = 1.0;
                                                      _node0_9->node->real[node1_9 * 0xf + 2] = 0.0;
                                                      ref_private_macro_code_rss_62 =
                                                           ref_node_add(_node0_9->node,5,&node1_9);
                                                      if (ref_private_macro_code_rss_62 == 0) {
                                                        _node0_9->node->real[node1_9 * 0xf] = 2.0;
                                                        _node0_9->node->real[node1_9 * 0xf + 1] =
                                                             0.0;
                                                        _node0_9->node->real[node1_9 * 0xf + 2] =
                                                             0.0;
                                                        tri2_2 = 1;
                                                        tri1_2 = 4;
                                                        nodes_4[0] = 2;
                                                        nodes_4[1] = 10;
                                                        ref_private_macro_code_rss_63 =
                                                             ref_cell_add(_node0_9->cell[3],&tri2_2,
                                                                          &allowed_4);
                                                        if (ref_private_macro_code_rss_63 == 0) {
                                                          tri2_2 = 1;
                                                          tri1_2 = 5;
                                                          nodes_4[0] = 4;
                                                          nodes_4[1] = 10;
                                                          local_588 = ref_cell_add(_node0_9->cell[3]
                                                                                   ,&tri2_2,&
                                                  ref_private_macro_code_rss_58);
                                                  if (local_588 == 0) {
                                                    ref_private_status_reis_ai_29._4_4_ =
                                                         ref_collapse_edge_same_normal
                                                                   (_node0_9,2,1,
                                                                    &ref_private_macro_code_rss_59);
                                                    if (ref_private_status_reis_ai_29._4_4_ == 0) {
                                                      ref_private_status_reis_bi_29 = 1;
                                                      lStack_5a0 = (long)
                                                  ref_private_macro_code_rss_59;
                                                  if (lStack_5a0 == 1) {
                                                    _node0_9->node->real[node1_9 * 0xf + 2] = 0.5;
                                                    ref_private_status_reis_ai_30._4_4_ =
                                                         ref_collapse_edge_same_normal
                                                                   (_node0_9,2,1,
                                                                    &ref_private_macro_code_rss_59);
                                                    if (ref_private_status_reis_ai_30._4_4_ == 0) {
                                                      ref_private_status_reis_bi_30 = 0;
                                                      lStack_5b8 = (long)
                                                  ref_private_macro_code_rss_59;
                                                  if (lStack_5b8 == 0) {
                                                    _node0_9->node->real[node1_9 * 0xf] = 2.0;
                                                    _node0_9->node->real[node1_9 * 0xf + 1] = -1.0;
                                                    _node0_9->node->real[node1_9 * 0xf + 2] = 0.0;
                                                    ref_private_status_reis_ai_31._4_4_ =
                                                         ref_collapse_edge_same_normal
                                                                   (_node0_9,2,4,
                                                                    &ref_private_macro_code_rss_59);
                                                    if (ref_private_status_reis_ai_31._4_4_ == 0) {
                                                      ref_private_status_reis_bi_31 = 0;
                                                      lStack_5d0 = (long)
                                                  ref_private_macro_code_rss_59;
                                                  if (lStack_5d0 == 0) {
                                                    ref_grid_11._4_4_ = ref_grid_free(_node0_9);
                                                    if (ref_grid_11._4_4_ == 0) {
                                                      local_5f0 = ref_fixture_tet_grid
                                                                            ((REF_GRID *)&node1_10,
                                                                                                                                                          
                                                  _ref_private_macro_code_rss_1);
                                                  if (local_5f0 == 0) {
                                                    allowed_5 = 0;
                                                    ref_private_macro_code_rss_67 = 1;
                                                    ref_private_status_reis_ai_32._4_4_ =
                                                         ref_collapse_edge_mixed
                                                                   (_node1_10,0,1,
                                                                    &ref_private_macro_code_rss_68);
                                                    if (ref_private_status_reis_ai_32._4_4_ == 0) {
                                                      ref_private_status_reis_bi_32 = 1;
                                                      lStack_608 = (long)
                                                  ref_private_macro_code_rss_68;
                                                  if (lStack_608 == 1) {
                                                    ref_grid_12._4_4_ = ref_grid_free(_node1_10);
                                                    if (ref_grid_12._4_4_ == 0) {
                                                      local_628 = ref_fixture_pri_tet_cap_grid
                                                                            ((REF_GRID *)&node1_11,
                                                                                                                                                          
                                                  _ref_private_macro_code_rss_1);
                                                  if (local_628 == 0) {
                                                    allowed_6 = 5;
                                                    ref_private_macro_code_rss_70 = 6;
                                                    ref_private_status_reis_ai_33._4_4_ =
                                                         ref_collapse_edge_mixed
                                                                   (_node1_11,5,6,
                                                                    &ref_private_macro_code_rss_71);
                                                    if (ref_private_status_reis_ai_33._4_4_ == 0) {
                                                      ref_private_status_reis_bi_33 = 1;
                                                      lStack_640 = (long)
                                                  ref_private_macro_code_rss_71;
                                                  if (lStack_640 == 1) {
                                                    allowed_6 = 6;
                                                    ref_private_macro_code_rss_70 = 5;
                                                    ref_private_status_reis_ai_34._4_4_ =
                                                         ref_collapse_edge_mixed
                                                                   (_node1_11,6,5,
                                                                    &ref_private_macro_code_rss_71);
                                                    if (ref_private_status_reis_ai_34._4_4_ == 0) {
                                                      ref_private_status_reis_bi_34 = 0;
                                                      lStack_658 = (long)
                                                  ref_private_macro_code_rss_71;
                                                  if (lStack_658 == 0) {
                                                    allowed_6 = 3;
                                                    ref_private_macro_code_rss_70 = 4;
                                                    ref_private_status_reis_ai_35._4_4_ =
                                                         ref_collapse_edge_mixed
                                                                   (_node1_11,3,4,
                                                                    &ref_private_macro_code_rss_71);
                                                    if (ref_private_status_reis_ai_35._4_4_ == 0) {
                                                      ref_private_status_reis_bi_35 = 0;
                                                      lStack_670 = (long)
                                                  ref_private_macro_code_rss_71;
                                                  if (lStack_670 == 0) {
                                                    ref_grid_13._4_4_ = ref_grid_free(_node1_11);
                                                    if (ref_grid_13._4_4_ == 0) {
                                                      local_690 = ref_fixture_tet_grid
                                                                            ((REF_GRID *)&node1_12,
                                                                                                                                                          
                                                  _ref_private_macro_code_rss_1);
                                                  if (local_690 == 0) {
                                                    allowed_7 = 0;
                                                    ref_private_macro_code_rss_75 = 1;
                                                    ref_private_status_reis_ai_36._4_4_ =
                                                         ref_collapse_edge_local_cell
                                                                   (_node1_12,0,1,
                                                                    &ref_private_macro_code_rss_76);
                                                    if (ref_private_status_reis_ai_36._4_4_ == 0) {
                                                      ref_private_status_reis_bi_36 = 1;
                                                      lStack_6a8 = (long)
                                                  ref_private_macro_code_rss_76;
                                                  if (lStack_6a8 == 1) {
                                                    _node1_12->node->part[2] =
                                                         _node1_12->node->part[2] + 1;
                                                    allowed_7 = 0;
                                                    ref_private_macro_code_rss_75 = 1;
                                                    ref_private_status_reis_ai_37._4_4_ =
                                                         ref_collapse_edge_local_cell
                                                                   (_node1_12,0,1,
                                                                    &ref_private_macro_code_rss_76);
                                                    if (ref_private_status_reis_ai_37._4_4_ == 0) {
                                                      ref_private_status_reis_bi_37 = 0;
                                                      lStack_6c0 = (long)
                                                  ref_private_macro_code_rss_76;
                                                  if (lStack_6c0 == 0) {
                                                    ref_grid_14._4_4_ = ref_grid_free(_node1_12);
                                                    if (ref_grid_14._4_4_ == 0) {
                                                      ref_private_status_reis_ai_38._4_4_ =
                                                           ref_fixture_tet_grid
                                                                     ((REF_GRID *)
                                                                      &ref_private_macro_code_rss_80
                                                                      ,_ref_private_macro_code_rss_1
                                                                     );
                                                      if (ref_private_status_reis_ai_38._4_4_ == 0)
                                                      {
                                                        ref_private_status_reis_ai_38._0_4_ =
                                                             ref_collapse_pass(
                                                  _ref_private_macro_code_rss_80);
                                                  if ((uint)ref_private_status_reis_ai_38 == 0) {
                                                    ref_private_status_reis_bi_38 = 4;
                                                    ref_private_status_reis_ai_39 =
                                                         (REF_LONG)
                                                         _ref_private_macro_code_rss_80->node->n;
                                                    if (ref_private_status_reis_ai_39 == 4) {
                                                      ref_private_status_reis_bi_39 = 1;
                                                      lStack_6f8 = (long)
                                                  _ref_private_macro_code_rss_80->cell[8]->n;
                                                  if (lStack_6f8 == 1) {
                                                    ref_grid_15._4_4_ =
                                                         ref_grid_free(
                                                  _ref_private_macro_code_rss_80);
                                                  if (ref_grid_15._4_4_ == 0) {
                                                    ref_private_macro_code_rss_84 =
                                                         ref_fixture_tet_grid
                                                                   ((REF_GRID *)
                                                                    &ref_private_macro_code_rss_83,
                                                                    _ref_private_macro_code_rss_1);
                                                    if (ref_private_macro_code_rss_84 == 0) {
                                                      local_710 = ref_node_metric_form
                                                                            (
                                                  _ref_private_macro_code_rss_83->node,3,1.0,0.0,0.0
                                                  ,1.0,0.0,0.01);
                                                  if (local_710 == 0) {
                                                    ref_private_status_reis_ai_40._4_4_ =
                                                         ref_collapse_pass(
                                                  _ref_private_macro_code_rss_83);
                                                  if (ref_private_status_reis_ai_40._4_4_ == 0) {
                                                    ref_private_status_reis_bi_40 = 3;
                                                    ref_private_status_reis_ai_41 =
                                                         (REF_LONG)
                                                         _ref_private_macro_code_rss_83->node->n;
                                                    if (ref_private_status_reis_ai_41 == 3) {
                                                      ref_private_status_reis_bi_41 = 0;
                                                      lStack_738 = (long)
                                                  _ref_private_macro_code_rss_83->cell[8]->n;
                                                  if (lStack_738 == 0) {
                                                    ref_grid_16._4_4_ =
                                                         ref_grid_free(
                                                  _ref_private_macro_code_rss_83);
                                                  if (ref_grid_16._4_4_ == 0) {
                                                    local_758 = ref_fixture_tri2_grid
                                                                          ((REF_GRID *)&remove,
                                                                                                                                                      
                                                  _ref_private_macro_code_rss_1);
                                                  if (local_758 == 0) {
                                                    allowed_8 = 2;
                                                    ref_private_macro_code_rss_86 = 0;
                                                    ref_private_status_reis_ai_42._4_4_ =
                                                         ref_collapse_edge_same_tangent
                                                                   (_remove,2,0,
                                                                    &ref_private_macro_code_rss_87);
                                                    if (ref_private_status_reis_ai_42._4_4_ == 0) {
                                                      ref_private_status_reis_bi_42 = 1;
                                                      lStack_770 = (long)
                                                  ref_private_macro_code_rss_87;
                                                  if (lStack_770 == 1) {
                                                    _remove->node->real
                                                    [ref_private_macro_code_rss_86 * 0xf + 1] = 0.5;
                                                    ref_private_status_reis_ai_43._4_4_ =
                                                         ref_collapse_edge_same_tangent
                                                                   (_remove,allowed_8,
                                                                    ref_private_macro_code_rss_86,
                                                                    &ref_private_macro_code_rss_87);
                                                    if (ref_private_status_reis_ai_43._4_4_ == 0) {
                                                      ref_private_status_reis_bi_43 = 0;
                                                      lStack_788 = (long)
                                                  ref_private_macro_code_rss_87;
                                                  if (lStack_788 == 0) {
                                                    ref_grid_17._4_4_ = ref_grid_free(_remove);
                                                    if (ref_grid_17._4_4_ == 0) {
                                                      ref_private_status_reis_ai_44._4_4_ =
                                                           ref_fixture_tri_grid
                                                                     ((REF_GRID *)
                                                                      &ref_private_macro_code_rss_91
                                                                      ,_ref_private_macro_code_rss_1
                                                                     );
                                                      if (ref_private_status_reis_ai_44._4_4_ == 0)
                                                      {
                                                        ref_private_status_reis_ai_44._0_4_ =
                                                             ref_collapse_pass(
                                                  _ref_private_macro_code_rss_91);
                                                  if ((uint)ref_private_status_reis_ai_44 == 0) {
                                                    ref_private_status_reis_bi_44 = 1;
                                                    ref_private_status_reis_ai_45 =
                                                         (REF_LONG)
                                                         _ref_private_macro_code_rss_91->cell[3]->n;
                                                    if (ref_private_status_reis_ai_45 == 1) {
                                                      ref_private_status_reis_bi_45 = 0;
                                                      lStack_7c0 = (long)
                                                  _ref_private_macro_code_rss_91->cell[6]->n;
                                                  if (lStack_7c0 == 0) {
                                                    ref_grid_18._4_4_ =
                                                         ref_grid_free(
                                                  _ref_private_macro_code_rss_91);
                                                  if (ref_grid_18._4_4_ == 0) {
                                                    uVar1 = ref_fixture_tri_grid
                                                                      ((REF_GRID *)
                                                                       &
                                                  ref_private_macro_code_rss_94,
                                                  _ref_private_macro_code_rss_1);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_node_metric_form
                                                                      (
                                                  _ref_private_macro_code_rss_94->node,1,1.0,0.0,0.0
                                                  ,0.01,0.0,1.0);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_collapse_pass(
                                                  _ref_private_macro_code_rss_94);
                                                  if (uVar1 == 0) {
                                                    lVar2 = (long)_ref_private_macro_code_rss_94->
                                                                  node->n;
                                                    if (lVar2 == 2) {
                                                      lVar2 = (long)_ref_private_macro_code_rss_94->
                                                                    cell[3]->n;
                                                      if (lVar2 == 0) {
                                                        lVar2 = (long)_ref_private_macro_code_rss_94
                                                                      ->cell[10]->n;
                                                        if (lVar2 == 0) {
                                                          uVar1 = ref_grid_free(
                                                  _ref_private_macro_code_rss_94);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_mpi_free(
                                                  _ref_private_macro_code_rss_1);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_mpi_stop();
                                                    if (uVar1 == 0) {
                                                      argv_local._4_4_ = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x263,"main",(ulong)uVar1,"stop");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x262,"main",(ulong)uVar1,"free");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x25f,"main",(ulong)uVar1,"free grid");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x25d,"main","pri",0,lVar2);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x25c,"main","tri",0,lVar2);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x25b,"main","nodes",2,lVar2);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x259,"main",(ulong)uVar1,"pass");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,599,"main",(ulong)uVar1,"set top z big");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x253,"main",(ulong)uVar1,"set up");
                                                  argv_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x24d,"main",(ulong)ref_grid_18._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_18._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x24b,"main","qua",0,lStack_7c0);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x24a,"main","tri",1,
                                                  ref_private_status_reis_ai_45);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x248,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_44,"pass")
                                                  ;
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_44;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x246,"main",
                                                  (ulong)ref_private_status_reis_ai_44._4_4_,
                                                  "set up");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_44._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x240,"main",(ulong)ref_grid_17._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_17._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x23e,"main","curved boundary collapse allowed?",
                                                  0,lStack_788);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x23d,"main",
                                                  (ulong)ref_private_status_reis_ai_43._4_4_,"same")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_43._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x238,"main","straight tangent collapse allowed?"
                                                  ,1,lStack_770);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x237,"main",
                                                  (ulong)ref_private_status_reis_ai_42._4_4_,"same")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_42._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x232,"main",(ulong)local_758,"set up");
                                                  argv_local._4_4_ = local_758;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x22a,"main",(ulong)ref_grid_16._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_16._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x228,"main","tets",0,lStack_738);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x227,"main","nodes",3,
                                                  ref_private_status_reis_ai_41);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x223,"main",
                                                  (ulong)ref_private_status_reis_ai_40._4_4_,"pass")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_40._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x221,"main",(ulong)local_710,"set top z big");
                                                  argv_local._4_4_ = local_710;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x21d,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_84,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_84;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x217,"main",(ulong)ref_grid_15._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_15._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x215,"main","tets",1,lStack_6f8);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x214,"main","nodes",4,
                                                  ref_private_status_reis_ai_39);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x212,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_38,"pass")
                                                  ;
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_38;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x210,"main",
                                                  (ulong)ref_private_status_reis_ai_38._4_4_,
                                                  "set up");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_38._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x20a,"main",(ulong)ref_grid_14._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_14._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x208,"main","ghost collapse allowed?",0,
                                                  lStack_6c0);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x207,"main",
                                                  (ulong)ref_private_status_reis_ai_37._4_4_,
                                                  "col loc");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_37._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1ff,"main","local collapse allowed?",1,
                                                  lStack_6a8);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1fe,"main",
                                                  (ulong)ref_private_status_reis_ai_36._4_4_,
                                                  "col loc");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_36._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1f9,"main",(ulong)local_690,"set up");
                                                  argv_local._4_4_ = local_690;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1f1,"main",(ulong)ref_grid_13._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_13._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1ef,"main","mixed collapse allowed?",0,
                                                  lStack_670);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1ee,"main",
                                                  (ulong)ref_private_status_reis_ai_35._4_4_,
                                                  "col mixed");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_35._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1ea,"main","tet changing mixed allowed?",0,
                                                  lStack_658);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1e9,"main",
                                                  (ulong)ref_private_status_reis_ai_34._4_4_,
                                                  "col mixed");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_34._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1e5,"main","tet near mixed allowed?",1,
                                                  lStack_640);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1e4,"main",
                                                  (ulong)ref_private_status_reis_ai_33._4_4_,
                                                  "col mixed");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_33._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1e0,"main",(ulong)local_628,"set up");
                                                  argv_local._4_4_ = local_628;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1d9,"main",(ulong)ref_grid_12._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_12._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1d7,"main","pure tet allowed?",1,lStack_608);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1d5,"main",
                                                  (ulong)ref_private_status_reis_ai_32._4_4_,
                                                  "col mixed");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_32._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1d1,"main",(ulong)local_5f0,"set up");
                                                  argv_local._4_4_ = local_5f0;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1c9,"main",(ulong)ref_grid_11._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_11._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1c7,"main","tri will have zero area",0,
                                                  lStack_5d0);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1c6,"main",
                                                  (ulong)ref_private_status_reis_ai_31._4_4_,"norm")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_31._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1bd,"main","normal would change",0,lStack_5b8);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1bc,"main",
                                                  (ulong)ref_private_status_reis_ai_30._4_4_,"norm")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_30._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1b7,"main","normal will be the same",1,
                                                  lStack_5a0);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1b6,"main",
                                                  (ulong)ref_private_status_reis_ai_29._4_4_,"norm")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_29._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1b1,"main",(ulong)local_588,"add tri");
                                                  argv_local._4_4_ = local_588;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1ac,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_63,
                                                  "add tri");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_63;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x1a3,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_62,
                                                  "add node");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_62;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x19e,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_61,
                                                  "add node");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_61;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x195,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_60,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_60;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x18a,"main",(ulong)ref_grid_10._4_4_,"free grid"
                                                  );
                                                  argv_local._4_4_ = ref_grid_10._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x188,"main","parallel along geom edge?",1,
                                                  lStack_530);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x187,"main",
                                                  (ulong)ref_private_status_reis_ai_28._4_4_,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_28._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x182,"main","pull off edge?",0,lStack_518);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x181,"main",
                                                  (ulong)ref_private_status_reis_ai_27._4_4_,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_27._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x17c,"main","pull to edge?",1,lStack_500);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x17b,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_26,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_26;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x175,"main",
                                                  (ulong)ref_private_status_reis_ai_26._4_4_,
                                                  "add node geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_26._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x16f,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_54,
                                                  "add node geom");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_54;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x168,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_53,
                                                  "add tri");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_53;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x163,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_52,
                                                  "add tri");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_52;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x157,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_51,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_51;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x14b,"main",(ulong)ref_grid_9._4_4_,"free grid")
                                                  ;
                                                  argv_local._4_4_ = ref_grid_9._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x149,"main","interior edge allowed?",0,
                                                  lStack_478);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x147,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_25,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_25;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x142,"main",
                                                  (ulong)ref_private_status_reis_ai_25._4_4_,
                                                  "add node geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_25._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x13c,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_47,
                                                  "remove tri");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_47;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x13b,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_46,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_46;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x131,"main",(ulong)ref_grid_8._4_4_,"free grid")
                                                  ;
                                                  argv_local._4_4_ = ref_grid_8._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x12f,"main","parallel along geom edge?",1,
                                                  lStack_418);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x12e,"main",
                                                  (ulong)ref_private_status_reis_ai_24._4_4_,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_24._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x127,"main","parallel and interior to face?",1,
                                                  lStack_400);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x126,"main",
                                                  (ulong)ref_private_status_reis_ai_23._4_4_,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_23._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x121,"main","interior node to face?",1,
                                                  lStack_3e8);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x120,"main",
                                                  (ulong)ref_private_status_reis_ai_22._4_4_,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_22._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x11b,"main",(ulong)local_3d0,"add tri");
                                                  argv_local._4_4_ = local_3d0;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x116,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_40,
                                                  "add tri");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_40;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x10a,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_39,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_39;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xcc,"main",(ulong)ref_grid_7._4_4_,"free grid");
                                                  argv_local._4_4_ = ref_grid_7._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xca,"main","interior edge allowed?",1,lStack_388
                                                  );
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,200,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_21,
                                                  "col geom");
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_21;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xc3,"main",
                                                  (ulong)ref_private_status_reis_ai_21._4_4_,
                                                  "remove tri");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_21._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xc2,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_35,
                                                  "set up");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_35;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xba,"main",(ulong)ref_grid_6._4_4_,"free grid");
                                                  argv_local._4_4_ = ref_grid_6._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb8,"main","2",2,lStack_350);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb7,"main","1",3,ref_private_status_reis_ai_20);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb6,"main",
                                                  (ulong)ref_private_status_reis_ai_19._4_4_,"nodes"
                                                  );
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_19._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb4,"main","2",2,lStack_328);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb3,"main","1",3,ref_private_status_reis_ai_18);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb2,"main","0",0,ref_private_status_reis_ai_17);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xb1,"main",
                                                  (ulong)ref_private_status_reis_ai_16._4_4_,"nodes"
                                                  );
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_16._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xaf,"main","edg",1,lStack_2f0);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xae,"main","tri",1,ref_private_status_reis_ai_15
                                                  );
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xad,"main","tet",0,ref_private_status_reis_ai_14
                                                  );
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xab,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_13,
                                                  "collapse");
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_13;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0xa7,"main",
                                                  (ulong)ref_private_status_reis_ai_13._4_4_,
                                                  "set up");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_13._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x9f,"main",(ulong)ref_grid_5._4_4_,"free grid");
                                                  argv_local._4_4_ = ref_grid_5._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x9d,"main","val",0,lStack_228);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x9c,"main","n",3,ref_private_status_reis_ai_12);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x9a,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_11,
                                                  "collapse");
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_11;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x96,"main",
                                                  (ulong)ref_private_status_reis_ai_11._4_4_,
                                                  "set up");
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_11._4_4_;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x8f,"main",(ulong)ref_grid_4._4_4_,"free grid");
                                                  argv_local._4_4_ = ref_grid_4._4_4_;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x8d,"main","edg",0,lStack_1e8);
                                                argv_local._4_4_ = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x8c,"main","tri",0,ref_private_status_reis_ai_10
                                                  );
                                              argv_local._4_4_ = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                  ,0x8b,"main","tet",0,ref_private_status_reis_ai_9)
                                            ;
                                            argv_local._4_4_ = 1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                                 ,0x89,"main",
                                                 (ulong)(uint)ref_private_status_reis_ai_8,
                                                 "collapse");
                                          argv_local._4_4_ = (uint)ref_private_status_reis_ai_8;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                               ,0x85,"main",
                                               (ulong)ref_private_status_reis_ai_8._4_4_,"set up");
                                        argv_local._4_4_ = ref_private_status_reis_ai_8._4_4_;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                             ,0x7e,"main",(ulong)ref_grid_3._4_4_,"free grid");
                                      argv_local._4_4_ = ref_grid_3._4_4_;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                           ,0x7c,"main","2",2,lStack_198);
                                    argv_local._4_4_ = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                         ,0x7b,"main","1",0,ref_private_status_reis_ai_7);
                                  argv_local._4_4_ = 1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                       ,0x7a,"main",(ulong)ref_private_status_reis_ai_6._4_4_,
                                       "nodes");
                                argv_local._4_4_ = ref_private_status_reis_ai_6._4_4_;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                     ,0x78,"main","edg",1,lStack_170);
                              argv_local._4_4_ = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                   ,0x77,"main","tri",0,ref_private_status_reis_ai_5);
                            argv_local._4_4_ = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                                 ,0x76,"main","tet",0,ref_private_status_reis_ai_4);
                          argv_local._4_4_ = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                               ,0x74,"main",(ulong)(uint)ref_private_status_reis_ai_3,"collapse");
                        argv_local._4_4_ = (uint)ref_private_status_reis_ai_3;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x70,"main",(ulong)ref_private_status_reis_ai_3._4_4_,"set up");
                      argv_local._4_4_ = ref_private_status_reis_ai_3._4_4_;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                           ,0x68,"main",(ulong)ref_grid_2._4_4_,"free grid");
                    argv_local._4_4_ = ref_grid_2._4_4_;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                         ,0x66,"main","edg",1,lStack_b0);
                  argv_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                       ,0x65,"main","tri",1,ref_private_status_reis_ai_2);
                argv_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                     ,100,"main","tet",0,ref_private_status_reis_ai_1);
              argv_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                   ,0x62,"main",(ulong)(uint)ref_private_status_reis_ai,"collapse");
            argv_local._4_4_ = (uint)ref_private_status_reis_ai;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                 ,0x5e,"main",(ulong)ref_private_status_reis_ai._4_4_,"set up");
          argv_local._4_4_ = ref_private_status_reis_ai._4_4_;
        }
      }
      else {
        ref_private_macro_code_rss_4 =
             ref_part_by_extension
                       ((REF_GRID *)&ref_private_macro_code_rss_2,_ref_private_macro_code_rss_1,
                        *(char **)&ref_mpi->max_tag);
        if (ref_private_macro_code_rss_4 == 0) {
          ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"read grid");
          ref_private_macro_code_rss_5 =
               ref_part_metric(_ref_private_macro_code_rss_2->node,(char *)ref_mpi->comm);
          if (ref_private_macro_code_rss_5 == 0) {
            ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"read metric");
            if (3 < (int)argv_local) {
              ref_private_macro_code_rss_6 =
                   ref_egads_load(_ref_private_macro_code_rss_2->geom,(char *)ref_mpi->start_time);
              if (ref_private_macro_code_rss_6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                       ,0x40,"main",(ulong)(uint)ref_private_macro_code_rss_6,"load egads geom");
                return ref_private_macro_code_rss_6;
              }
              ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"load geom");
            }
            ref_private_macro_code_rss_7 = ref_validation_cell_volume(_ref_private_macro_code_rss_2)
            ;
            if (ref_private_macro_code_rss_7 == 0) {
              ref_private_macro_code_rss_8 = ref_histogram_quality(_ref_private_macro_code_rss_2);
              if (ref_private_macro_code_rss_8 == 0) {
                ref_private_macro_code_rss_9 = ref_histogram_ratio(_ref_private_macro_code_rss_2);
                if (ref_private_macro_code_rss_9 == 0) {
                  ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"stats");
                  for (ref_private_macro_code_rss_3 = 0; ref_private_macro_code_rss_3 < 5;
                      ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
                    ref_private_macro_code_rss_10 = ref_collapse_pass(_ref_private_macro_code_rss_2)
                    ;
                    if (ref_private_macro_code_rss_10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x4a,"main",(ulong)(uint)ref_private_macro_code_rss_10,"col pass");
                      return ref_private_macro_code_rss_10;
                    }
                    ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"adapt col");
                    ref_private_macro_code_rss_11 =
                         ref_validation_cell_volume(_ref_private_macro_code_rss_2);
                    if (ref_private_macro_code_rss_11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x4d,"main",(ulong)(uint)ref_private_macro_code_rss_11,"vol");
                      return ref_private_macro_code_rss_11;
                    }
                    ref_private_macro_code_rss_12 =
                         ref_histogram_quality(_ref_private_macro_code_rss_2);
                    if (ref_private_macro_code_rss_12 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x4e,"main",(ulong)(uint)ref_private_macro_code_rss_12,"gram");
                      return ref_private_macro_code_rss_12;
                    }
                    ref_private_macro_code_rss_13 =
                         ref_histogram_ratio(_ref_private_macro_code_rss_2);
                    if (ref_private_macro_code_rss_13 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x4f,"main",(ulong)(uint)ref_private_macro_code_rss_13,"gram");
                      return ref_private_macro_code_rss_13;
                    }
                    ref_mpi_stopwatch_stop(_ref_private_macro_code_rss_2->mpi,"stats");
                  }
                  ref_private_macro_code_rss_14 = ref_grid_free(_ref_private_macro_code_rss_2);
                  if (ref_private_macro_code_rss_14 == 0) {
                    ref_grid_1._4_4_ = ref_mpi_free(_ref_private_macro_code_rss_1);
                    if (ref_grid_1._4_4_ == 0) {
                      ref_grid_1._0_4_ = ref_mpi_stop();
                      if ((uint)ref_grid_1 == 0) {
                        argv_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                               ,0x56,"main",(ulong)(uint)ref_grid_1,"stop");
                        argv_local._4_4_ = (uint)ref_grid_1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,0x55,"main",(ulong)ref_grid_1._4_4_,"free");
                      argv_local._4_4_ = ref_grid_1._4_4_;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                           ,0x53,"main",(ulong)(uint)ref_private_macro_code_rss_14,"free");
                    argv_local._4_4_ = ref_private_macro_code_rss_14;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                         ,0x46,"main",(ulong)(uint)ref_private_macro_code_rss_9,"gram");
                  argv_local._4_4_ = ref_private_macro_code_rss_9;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                       ,0x45,"main",(ulong)(uint)ref_private_macro_code_rss_8,"gram");
                argv_local._4_4_ = ref_private_macro_code_rss_8;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                     ,0x44,"main",(ulong)(uint)ref_private_macro_code_rss_7,"vol");
              argv_local._4_4_ = ref_private_macro_code_rss_7;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                   ,0x3d,"main",(ulong)(uint)ref_private_macro_code_rss_5,"get metric");
            argv_local._4_4_ = ref_private_macro_code_rss_5;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                 ,0x3b,"main",(ulong)(uint)ref_private_macro_code_rss_4,"examine header");
          argv_local._4_4_ = ref_private_macro_code_rss_4;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
             ,0x36,"main",(ulong)(uint)ref_grid,"create");
      argv_local._4_4_ = (uint)ref_grid;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,0x35,"main",(ulong)ref_grid._4_4_,"start");
    argv_local._4_4_ = ref_grid._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "create");

  if (argc > 2) {
    REF_GRID ref_grid;
    REF_INT pass;
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, argv[1]), "examine header");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read grid");
    RSS(ref_part_metric(ref_grid_node(ref_grid), argv[2]), "get metric");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read metric");
    if (argc > 3) {
      RSS(ref_egads_load(ref_grid_geom(ref_grid), argv[3]), "load egads geom");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "load geom");
    }

    RSS(ref_validation_cell_volume(ref_grid), "vol");
    RSS(ref_histogram_quality(ref_grid), "gram");
    RSS(ref_histogram_ratio(ref_grid), "gram");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");

    for (pass = 0; pass < 5; pass++) {
      RSS(ref_collapse_pass(ref_grid), "col pass");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");

      RSS(ref_validation_cell_volume(ref_grid), "vol");
      RSS(ref_histogram_quality(ref_grid), "gram");
      RSS(ref_histogram_ratio(ref_grid), "gram");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");
    }

    RSS(ref_grid_free(ref_grid), "free");

    RSS(ref_mpi_free(ref_mpi), "free");
    RSS(ref_mpi_stop(), "stop");
    return 0;
  }

  { /* collapse tet into triangle, keep renumbered edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, keep edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, no more edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 1;
    node1 = 2;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse removes node */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "n");
    REIS(REF_FALSE, ref_node_valid(ref_grid_node(ref_grid), 3), "val");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet, renumber triangle, renumber edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 3;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "0");
    REIS(3, nodes[1], "1");
    REIS(2, nodes[2], "2");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(3, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of volume node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  /*
         /  6252 \
     6253    e    5936
         /  6251 \
     6559    c    5937
      \   \  5938 /  |
        \     |   \ 6252r
          \  6560 /

start 6251 5938
remove cell 12781 nodes 6251 6559 5938  id 1186
remove cell 12154 nodes 5937 6251 5938  id 1186
old cell 12783 nodes 6560 6252 5938  id 1186
new cell 12783 nodes 6560 6252 6251  id 1186
old cell 12787 nodes 6559 6560 5938  id 1186
new cell 12787 nodes 6559 6560 6251  id 1186
old cell 12155 nodes 6252 5937 5938  id 1186
new cell 12155 nodes 6252 5937 6251  id 1186

quad 6251 6252
replaced
 item 0 cell 12155 nodes 6252 5937 6251 id 1186
 item 1 cell 12783 nodes 6560 6252 6251 id 1186
existing
 item 2 cell 12150 nodes 6252 6251 5936 id 1191
 item 3 cell 12780 nodes 6251 6252 6253 id 1192


  {
    REF_GRID ref_grid;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_grid_create(&ref_grid, ref_mpi), "set up");
    nodes[0] = 6251;
    nodes[1] = 6251;
    nodes[2] = 6251;
    nodes[3] = 6251;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

   */

  { /* geometry: collapse allowed on face? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \
    |  \|2 \
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 0;
    node1 = 3;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "interior node to face?");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel and interior to face?");

    ref_cell_c2n(ref_grid_tri(ref_grid), 3, tri2) = 20;

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of geom node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node = 1;
    type = REF_GEOM_NODE;
    id = 25;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_FALSE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse allowed on edge with jump? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \   edge 20, 1-2
    |  \|2 \  face all 10
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node = 1;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 1.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    node = 2;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 2.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    /* add jump? */

    node0 = 1;
    node1 = 4;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "pull to edge?");

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_FALSE, allowed, "pull off edge?");

    node0 = 1;
    node1 = 2;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* same normal after collapse? */
    REF_GRID ref_grid;
    REF_INT node;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4      y
    |\ 1|\
    |0\ | \    ^
    |  \|2 \   |
    0---1---5  +-> x
    */

    RSS(ref_node_add(ref_grid_node(ref_grid), 4, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    RSS(ref_node_add(ref_grid_node(ref_grid), 5, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 0.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 2;
    node1 = 1;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_TRUE, allowed, "normal will be the same");

    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.5;

    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "normal would change");

    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = -1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    node0 = 2;
    node1 = 4;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "tri will have zero area");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* mixed: collapse tet allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");

    REIS(REF_TRUE, allowed, "pure tet allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }
  { /* mixed: collapse of/near mixed allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_pri_tet_cap_grid(&ref_grid, ref_mpi), "set up");

    node0 = 5;
    node1 = 6;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_TRUE, allowed, "tet near mixed allowed?");

    node0 = 6;
    node1 = 5;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "tet changing mixed allowed?");

    node0 = 3;
    node1 = 4;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "mixed collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* local: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_TRUE, allowed, "local collapse allowed?");

    ref_node_part(ref_grid_node(ref_grid), 2) =
        ref_node_part(ref_grid_node(ref_grid), 2) + 1;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_FALSE, allowed, "ghost collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(4, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(1, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 3, 1, 0, 0, 1, 0,
                             1.0 / (10.0 * 10.0)),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    /* ref_export_by_extension(ref_grid,"ref_collapse_test.tec"); */

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* edge tangent: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT keep, remove;
    REF_BOOL allowed;

    RSS(ref_fixture_tri2_grid(&ref_grid, ref_mpi), "set up");

    keep = 2;
    remove = 0;
    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_TRUE, allowed, "straight tangent collapse allowed?");

    ref_node_xyz(ref_grid_node(ref_grid), 1, remove) = 0.5;

    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_FALSE, allowed, "curved boundary collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_qua(ref_grid)), "qua");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 1, 1, 0, 0,
                             1.0 / (10.0 * 10.0), 0, 1),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(2, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_pri(ref_grid)), "pri");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  RSS(ref_mpi_free(ref_mpi), "free");
  RSS(ref_mpi_stop(), "stop");
  return 0;
}